

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_set_restricted(Integer g_a,Integer *list,Integer size)

{
  global_array_t *pgVar1;
  C_Integer *pCVar2;
  global_array_t *pgVar3;
  uint uVar4;
  long lVar5;
  long icode;
  long lVar6;
  long lVar7;
  C_Integer CVar8;
  Integer IVar9;
  C_Integer CVar10;
  Integer local_50;
  
  pgVar3 = GA;
  lVar6 = g_a + 1000;
  GA[lVar6].num_rstrctd = size;
  pCVar2 = (C_Integer *)malloc(size * 8);
  pgVar3[lVar6].rstrctd_list = pCVar2;
  IVar9 = GAnproc;
  pCVar2 = (C_Integer *)malloc(GAnproc * 8);
  GA[lVar6].rank_rstrctd = pCVar2;
  pgVar3 = GA;
  uVar4 = GA[lVar6].p_handle;
  if (GA[lVar6].p_handle == 0xfffffffe) {
    uVar4 = GA_Default_Proc_Group;
  }
  if ((int)uVar4 < 1) {
    local_50 = IVar9;
    lVar7 = GAme;
  }
  else {
    local_50 = (Integer)PGRP_LIST[uVar4].map_nproc;
    lVar7 = (long)PGRP_LIST[uVar4].map_proc_list[GAme];
  }
  pgVar1 = GA + lVar6;
  for (lVar5 = 0; lVar5 < IVar9; lVar5 = lVar5 + 1) {
    pgVar1->rank_rstrctd[lVar5] = -1;
    IVar9 = GAnproc;
  }
  CVar10 = 0;
  if (size < 1) {
    size = CVar10;
  }
  CVar8 = 0;
  for (lVar5 = 0; size != lVar5; lVar5 = lVar5 + 1) {
    icode = list[lVar5];
    if (lVar7 == icode) {
      CVar10 = lVar5;
    }
    pgVar3[lVar6].rstrctd_list[lVar5] = icode;
    if (lVar7 == icode) {
      CVar8 = 1;
    }
    if ((icode < 0) || (local_50 <= icode)) {
      pnga_error("Invalid processor in list",icode);
      icode = list[lVar5];
      pgVar3 = GA;
    }
    pgVar3[lVar6].rank_rstrctd[icode] = lVar5;
  }
  pgVar3[lVar6].has_data = CVar8;
  pgVar3[lVar6].rstrctd_id = CVar10;
  return;
}

Assistant:

void pnga_set_restricted(Integer g_a, Integer *list, Integer size)
{
  Integer i, ig, id=0, me, p_handle, has_data, nproc;
  Integer ga_handle = g_a + GA_OFFSET;
  GA[ga_handle].num_rstrctd = size;
  GA[ga_handle].rstrctd_list = (Integer*)malloc(size*sizeof(Integer));
  GA[ga_handle].rank_rstrctd = (Integer*)malloc((GAnproc)*sizeof(Integer));
  p_handle = GA[ga_handle].p_handle;
  if (p_handle == -2) p_handle = pnga_pgroup_get_default();
  if (p_handle > 0) {
    me = PGRP_LIST[p_handle].map_proc_list[GAme];
    nproc = PGRP_LIST[p_handle].map_nproc;
  } else {
    me = GAme;
    nproc = GAnproc;
  }
  has_data = 0;

  for (i=0; i<GAnproc; i++) {
    GA[ga_handle].rank_rstrctd[i] = -1;
  }

  for (i=0; i<size; i++) {
    GA[ga_handle].rstrctd_list[i] = list[i];
    /* check if processor is in list */
    if (me == list[i]) {
      has_data = 1;
      id = i;
    }
    /* check if processor is in group */
    if (list[i] < 0 || list[i] >= nproc)
      pnga_error("Invalid processor in list",list[i]);
    ig = list[i];
    GA[ga_handle].rank_rstrctd[ig] = i;
  }
  GA[ga_handle].has_data = has_data;
  GA[ga_handle].rstrctd_id = id;
}